

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_usingCDict_advanced
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params_00;
  U32 UVar1;
  size_t sVar2;
  undefined8 uVar3;
  uint local_100;
  uint local_fc;
  uint local_f8;
  U32 limitedSrcLog;
  U32 limitedSrcSize;
  undefined8 local_dc;
  undefined8 local_d4;
  ZSTD_strategy local_cc;
  undefined4 uStack_c8;
  uint uStack_c4;
  ZSTD_CCtx_params params;
  unsigned_long_long pledgedSrcSize_local;
  ZSTD_CDict *cdict_local;
  ZSTD_CCtx *cctx_local;
  ZSTD_frameParameters fParams_local;
  
  uVar3 = fParams._0_8_;
  if (cdict == (ZSTD_CDict *)0x0) {
    fParams_local.checksumFlag = -0x20;
    fParams_local.noDictIDFlag = -1;
  }
  else {
    params.customMem.opaque = (void *)pledgedSrcSize;
    memcpy(&uStack_c8,&cctx->requestedParams,0x80);
    ZSTD_getCParamsFromCDict((ZSTD_compressionParameters *)&limitedSrcLog,cdict);
    uStack_c4 = (uint)_limitedSrcLog;
    params.format = SUB84(_limitedSrcLog,4);
    params.cParams.windowLog = (uint)local_dc;
    params.cParams.chainLog = SUB84(local_dc,4);
    params.cParams.hashLog = (uint)local_d4;
    params.cParams.searchLog = SUB84(local_d4,4);
    params.cParams.minMatch = local_cc;
    if (params.customMem.opaque != (void *)0xffffffffffffffff) {
      if (params.customMem.opaque < (void *)0x80000) {
        local_f8 = (uint)params.customMem.opaque;
      }
      else {
        local_f8 = 0x80000;
      }
      if (local_f8 < 2) {
        local_fc = 1;
      }
      else {
        UVar1 = ZSTD_highbit32(local_f8 - 1);
        local_fc = UVar1 + 1;
      }
      if (local_fc < uStack_c4) {
        local_100 = uStack_c4;
      }
      else {
        local_100 = local_fc;
      }
      uStack_c4 = local_100;
    }
    params_00.cParams.windowLog = uStack_c4;
    params_00.format = uStack_c8;
    params_00.cParams.hashLog = params.cParams.windowLog;
    params_00.cParams.chainLog = params.format;
    params_00.cParams.minMatch = params.cParams.hashLog;
    params_00.cParams.searchLog = params.cParams.chainLog;
    params_00.cParams.strategy = params.cParams.minMatch;
    params_00.cParams.targetLength = params.cParams.searchLog;
    params_00.compressionLevel = params.fParams.checksumFlag;
    params_00.fParams.noDictIDFlag = fParams.noDictIDFlag;
    params_00.fParams.contentSizeFlag = (uint)uVar3;
    params_00.fParams.checksumFlag = SUB84(uVar3,4);
    params_00.forceWindow = params.fParams.noDictIDFlag;
    params_00.attachDictPref = params.compressionLevel;
    params_00.nbWorkers = params.forceWindow;
    params_00._60_4_ = params.attachDictPref;
    params_00.jobSize = params._56_8_;
    params_00.overlapLog = (undefined4)params.jobSize;
    params_00.rsyncable = params.jobSize._4_4_;
    params_00.ldmParams.enableLdm = params.overlapLog;
    params_00.ldmParams.hashLog = params.rsyncable;
    params_00.ldmParams.bucketSizeLog = params.ldmParams.enableLdm;
    params_00.ldmParams.minMatchLength = params.ldmParams.hashLog;
    params_00.ldmParams.hashRateLog = params.ldmParams.bucketSizeLog;
    params_00.ldmParams.windowLog = params.ldmParams.minMatchLength;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)params.ldmParams._16_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)params.customMem.customAlloc;
    params_00.customMem.opaque = params.customMem.customFree;
    params.cParams._20_8_ = uVar3;
    params.fParams.contentSizeFlag = fParams.noDictIDFlag;
    fParams_local._4_8_ =
         ZSTD_compressBegin_internal
                   (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,cdict,params_00,
                    (U64)params.customMem.opaque,ZSTDb_not_buffered);
  }
  sVar2._0_4_ = fParams_local.checksumFlag;
  sVar2._4_4_ = fParams_local.noDictIDFlag;
  return sVar2;
}

Assistant:

size_t ZSTD_compressBegin_usingCDict_advanced(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_advanced");
    if (cdict==NULL) return ERROR(dictionary_wrong);
    {   ZSTD_CCtx_params params = cctx->requestedParams;
        params.cParams = ZSTD_getCParamsFromCDict(cdict);
        /* Increase window log to fit the entire dictionary and source if the
         * source size is known. Limit the increase to 19, which is the
         * window log for compression level 1 with the largest source size.
         */
        if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
            U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
            U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
            params.cParams.windowLog = MAX(params.cParams.windowLog, limitedSrcLog);
        }
        params.fParams = fParams;
        return ZSTD_compressBegin_internal(cctx,
                                           NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                           cdict,
                                           params, pledgedSrcSize,
                                           ZSTDb_not_buffered);
    }
}